

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshvolume.cpp
# Opt level: O3

float computeMeshVolume(float *vertices,uint tcount,uint *indices)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  float fVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  
  auVar9 = ZEXT816(0) << 0x40;
  auVar10 = ZEXT1664(auVar9);
  if (tcount != 0) {
    do {
      puVar1 = indices + 1;
      puVar2 = indices + 2;
      uVar3 = *indices;
      indices = indices + 3;
      tcount = tcount - 1;
      uVar6 = (ulong)(*puVar1 * 3);
      uVar7 = (ulong)(*puVar2 * 3);
      uVar5 = (ulong)(uVar3 * 3);
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(vertices[uVar7 + 1] * vertices[uVar6] *
                                             vertices[uVar5 + 2])),
                               ZEXT416((uint)vertices[uVar7 + 2]),
                               ZEXT416((uint)(vertices[uVar5] * vertices[uVar6 + 1])));
      auVar9 = vfmadd213ss_fma(ZEXT416((uint)(vertices[uVar7] * vertices[uVar5 + 1])),
                               ZEXT416((uint)vertices[uVar6 + 2]),auVar9);
      auVar9 = vfnmadd213ss_fma(ZEXT416((uint)(vertices[uVar7 + 1] * vertices[uVar5])),
                                ZEXT416((uint)vertices[uVar6 + 2]),auVar9);
      auVar9 = vfnmadd213ss_fma(ZEXT416((uint)(vertices[uVar5 + 1] * vertices[uVar6])),
                                ZEXT416((uint)vertices[uVar7 + 2]),auVar9);
      auVar9 = vfnmadd213ss_fma(ZEXT416((uint)(vertices[uVar6 + 1] * vertices[uVar7])),
                                ZEXT416((uint)vertices[uVar5 + 2]),auVar9);
      fVar4 = auVar10._0_4_ + auVar9._0_4_;
      auVar10 = ZEXT464((uint)fVar4);
    } while (tcount != 0);
    auVar9 = ZEXT416((uint)(fVar4 * 0.16666667));
  }
  auVar8._8_4_ = 0x80000000;
  auVar8._0_8_ = 0x8000000080000000;
  auVar8._12_4_ = 0x80000000;
  auVar8 = vxorps_avx512vl(auVar9,auVar8);
  auVar9 = vmaxss_avx(auVar8,auVar9);
  return auVar9._0_4_;
}

Assistant:

float computeMeshVolume(const float *vertices,unsigned int tcount,const unsigned int *indices)
{
	float volume = 0;

	for (unsigned int i=0; i<tcount; i++,indices+=3)
	{

		const float *p1 = &vertices[ indices[0]*3 ];
		const float *p2 = &vertices[ indices[1]*3 ];
		const float *p3 = &vertices[ indices[2]*3 ];

		volume+=det(p1,p2,p3); // compute the volume of the tetrahedron relative to the origin.
	}

	volume*=(1.0f/6.0f);
	if ( volume < 0 ) 
		volume*=-1;
	return volume;
}